

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_psbt_limits.c
# Opt level: O0

int main(void)

{
  uchar *p_00;
  uchar *p;
  size_t plen;
  size_t i;
  
  i._4_4_ = 0;
  p_00 = cliff((size_t *)&p);
  for (plen = 0; plen < 0x1a; plen = plen + 1) {
    test_psbt_read(invalid_psbts + plen,p_00,(size_t)p);
  }
  for (plen = 0; plen < 10; plen = plen + 1) {
    test_psbt_read(valid_psbts + plen,p_00,(size_t)p);
    test_psbt_write(valid_psbts + plen,p_00,(size_t)p);
  }
  wally_cleanup(0);
  return 0;
}

Assistant:

int main(void)
{
    size_t i;
    size_t plen;
    unsigned char *p = cliff(&plen);

    for (i = 0; i < sizeof(invalid_psbts) / sizeof(invalid_psbts[0]); i++) {
        test_psbt_read(invalid_psbts + i, p, plen);
    }

    for (i = 0; i < sizeof(valid_psbts) / sizeof(valid_psbts[0]); i++) {
        test_psbt_read(valid_psbts + i, p, plen);
        test_psbt_write(valid_psbts + i, p, plen);
    }

    wally_cleanup(0);
    return 0;
}